

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O1

void __thiscall
Minisat::Solver::simplifyLearnt<Minisat::vec<Minisat::Lit>>(Solver *this,vec<Minisat::Lit> *c)

{
  vec<Minisat::Lit> *this_00;
  uint64_t *puVar1;
  byte bVar2;
  uint uVar3;
  Lit *pLVar4;
  lbool *plVar5;
  VarData *pVVar6;
  Lit *pLVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  CRef confl;
  long lVar11;
  uint64_t uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int local_64;
  int local_4c;
  vec<unsigned_int> *local_48;
  long local_40;
  vec<int> *local_38;
  
  local_40 = (long)c->sz;
  this->original_length_record = this->original_length_record + local_40;
  this->trailRecord = (this->trail).sz;
  this->LCM_total_tries = this->LCM_total_tries + 1;
  local_38 = &this->trail_lim;
  this_00 = &this->simp_learnt_clause;
  local_48 = &this->simp_reason_clause;
  bVar10 = false;
  local_64 = 0;
  bVar9 = false;
  do {
    puVar1 = &(this->statistics).solveSteps;
    *puVar1 = *puVar1 + 1;
    if (bVar9) {
      uVar3 = c->sz;
      if ((ulong)uVar3 == 1) {
LAB_0011ed64:
        if ((bVar10) && (1 < (long)c->sz)) {
          pLVar4 = c->data;
          lVar14 = 0;
          lVar11 = (long)c->sz + -2;
          do {
            iVar15 = pLVar4[lVar14].x;
            pLVar4[lVar14].x = pLVar4[lVar11 + 1].x;
            pLVar4[lVar11 + 1].x = iVar15;
            lVar14 = lVar14 + 1;
            bVar9 = lVar14 < lVar11;
            lVar11 = lVar11 + -1;
          } while (bVar9);
        }
        this->LCM_successful_tries = this->LCM_successful_tries + (ulong)((int)local_40 != c->sz);
        return;
      }
      if (1 < (int)uVar3) {
        pLVar4 = c->data;
        lVar14 = 0;
        lVar11 = (ulong)uVar3 - 2;
        do {
          iVar15 = pLVar4[lVar14].x;
          pLVar4[lVar14].x = pLVar4[lVar11 + 1].x;
          pLVar4[lVar11 + 1].x = iVar15;
          lVar14 = lVar14 + 1;
          bVar8 = lVar14 < lVar11;
          lVar11 = lVar11 + -1;
        } while (bVar8);
      }
      bVar10 = (bool)(bVar10 ^ 1);
      local_64 = c->sz;
    }
    local_4c = (this->trail).sz;
    vec<int>::push(local_38,&local_4c);
    if (c->sz < 1) {
      iVar15 = 0;
    }
    else {
      lVar11 = 0;
      iVar15 = 0;
      do {
        pLVar4 = c->data;
        uVar3 = pLVar4[lVar11].x;
        iVar13 = (int)uVar3 >> 1;
        plVar5 = (this->assigns).data;
        bVar2 = plVar5[iVar13].value;
        if ((bVar2 & 2) == 0) {
          if (bVar2 == ((byte)uVar3 & 1)) {
            lVar14 = (long)iVar15;
            iVar15 = iVar15 + 1;
            pLVar4[lVar14].x = uVar3;
            bVar8 = true;
            confl = (this->vardata).data[pLVar4[lVar11].x >> 1].reason;
            goto LAB_0011ec03;
          }
        }
        else {
          plVar5[iVar13].value = (byte)(uVar3 ^ 1) & 1;
          pVVar6 = (this->vardata).data;
          pVVar6[iVar13].reason = 0xffffffff;
          pVVar6[iVar13].level = (this->trail_lim).sz;
          iVar13 = (this->trail).sz;
          (this->trail).sz = iVar13 + 1;
          (this->trail).data[iVar13].x = uVar3 ^ 1;
          lVar14 = (long)iVar15;
          iVar15 = iVar15 + 1;
          c->data[lVar14].x = c->data[lVar11].x;
          confl = simplePropagate(this);
          if (confl != 0xffffffff) {
            bVar8 = false;
            goto LAB_0011ec03;
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < c->sz);
    }
    bVar8 = false;
    confl = 0xffffffff;
LAB_0011ec03:
    if (iVar15 < c->sz) {
      c->sz = iVar15;
    }
    if (!(bool)(confl == 0xffffffff & (bVar8 ^ 1U))) {
      if (this_00->data != (Lit *)0x0) {
        (this->simp_learnt_clause).sz = 0;
      }
      if (local_48->data != (uint *)0x0) {
        (this->simp_reason_clause).sz = 0;
      }
      if (bVar8 != false) {
        vec<Minisat::Lit>::push(this_00,c->data + (long)c->sz + -1);
      }
      simpleAnalyze(this,confl,this_00,local_48,bVar8);
      if ((this->simp_learnt_clause).sz < c->sz) {
        if ((this->simp_learnt_clause).sz < 1) {
          lVar11 = 0;
        }
        else {
          pLVar4 = this_00->data;
          pLVar7 = c->data;
          lVar11 = 0;
          do {
            pLVar7[lVar11].x = pLVar4[lVar11].x;
            lVar11 = lVar11 + 1;
          } while (lVar11 < (this->simp_learnt_clause).sz);
        }
        if ((int)lVar11 < c->sz) {
          c->sz = (int)lVar11;
        }
      }
    }
    cancelUntil(this,0,false);
    cancelUntilTrailRecord(this);
    iVar15 = c->sz;
    this->simplified_length_record = this->simplified_length_record + (long)iVar15;
    iVar13 = (int)local_40 - iVar15;
    if ((iVar13 == 0) || (iVar15 < 2)) goto LAB_0011ed64;
    this->LCM_dropped_lits = this->LCM_dropped_lits + (long)iVar13;
    if (bVar9) {
      uVar12 = (long)(local_64 - iVar15) + this->LCM_dropped_reverse;
    }
    else {
      uVar12 = this->LCM_dropped_reverse;
    }
    this->LCM_dropped_reverse = uVar12;
    if ((bVar9) || (bVar9 = true, this->reverse_LCM == false)) goto LAB_0011ed64;
  } while( true );
}

Assistant:

inline void Solver::simplifyLearnt(C &c)
{
    ////
    original_length_record += c.size();

    trailRecord = trail.size(); // record the start pointer

    bool True_confl = false, reversed = false;
    int beforeSize = c.size(), preReserve = 0;
    int i, j;
    CRef confl = CRef_Undef;

    LCM_total_tries++;

    TRACE(std::cout << "c start simplifying clause " << c << std::endl);

    // try to simplify in reverse order, in case original succeeds
    for (size_t iteration = 0; iteration < (reverse_LCM ? 2 : 1); ++iteration) {
        True_confl = false;
        confl = CRef_Undef;
        statistics.solveSteps++;
        // reorder the current clause for next iteration?
        // (only useful if size changed in first iteration)
        if (iteration > 0) {
            if (c.size() == 1) break;
            c.reverse();
            reversed = !reversed;
            preReserve = c.size();
        }

        assert(decisionLevel() == 0 && "only run simplification on level 0");
        newDecisionLevel();
        assert(decisionLevel() == 1 && "only run simplification on level 0");

        for (i = 0, j = 0; i < c.size(); i++) {
            if (value(c[i]) == l_Undef) {
                // printf("///@@@ uncheckedEnqueue:index = %d. l_Undef\n", i);
                simpleUncheckEnqueue(~c[i]);
                c[j++] = c[i];
                confl = simplePropagate();
                if (confl != CRef_Undef) {
                    break;
                }
            } else {
                if (value(c[i]) == l_True) {
                    // printf("///@@@ uncheckedEnqueue:index = %d. l_True\n", i);
                    c[j++] = c[i];
                    True_confl = true;
                    confl = reason(var(c[i]));
                    break;
                } else {
                    // printf("///@@@ uncheckedEnqueue:index = %d. l_False\n", i);
                }
            }
        }
        TRACE(if (c.size() - j > 0) {
            std::cout << "c shrink clause after propagation to " << c << " (dropping last " << c.size() - j
                      << " literals, reverse=" << reversed << ")" << std::endl;
        });
        c.shrink(c.size() - j);

        if (confl != CRef_Undef || True_confl == true) {
            simp_learnt_clause.clear();
            simp_reason_clause.clear();
            if (True_confl == true) {
                simp_learnt_clause.push(c.last());
            }
            simpleAnalyze(confl, simp_learnt_clause, simp_reason_clause, True_confl);

            if (simp_learnt_clause.size() < c.size()) {
                for (i = 0; i < simp_learnt_clause.size(); i++) {
                    c[i] = simp_learnt_clause[i];
                }
                TRACE(if (c.size() - i > 0) {
                    std::cout << "c shrink clause after analysis to " << c << " (dropping last " << c.size() - i
                              << " literals, reverse=" << reversed << ")" << std::endl;
                });
                c.shrink(c.size() - i);
            }
        }

        assert(decisionLevel() == 1);
        cancelUntil(0);
        cancelUntilTrailRecord();
        assert(decisionLevel() == 0);

        ////
        simplified_length_record += c.size();

        // printf("\nbefore : %d, after : %d ", beforeSize, afterSize);
        if (beforeSize == c.size() || c.size() <= 1) break;
        TRACE(std::cout << "c simplified clause to " << c << " (before size: " << beforeSize << ")" << std::endl);
        LCM_dropped_lits += (beforeSize - c.size());
        LCM_dropped_reverse = iteration == 0 ? LCM_dropped_reverse : LCM_dropped_reverse + (preReserve - c.size());
    }

    // make sure the original order is restored, in case we resorted
    if (reversed) c.reverse();

    LCM_successful_tries = beforeSize == c.size() ? LCM_successful_tries : LCM_successful_tries + 1;
}